

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTestCase.cpp
# Opt level: O3

ConstTestNodeIterator * __thiscall
xe::ConstTestNodeIterator::operator++(ConstTestNodeIterator *this)

{
  pointer *ppGVar1;
  GroupState *pGVar2;
  iterator __position;
  TestGroup *pTVar3;
  int iVar4;
  ConstTestNodeIterator *pCVar5;
  int iVar6;
  GroupState *pGVar7;
  GroupState local_18;
  
  pGVar2 = (this->m_iterStack).
           super__Vector_base<xe::ConstTestNodeIterator::GroupState,_std::allocator<xe::ConstTestNodeIterator::GroupState>_>
           ._M_impl.super__Vector_impl_data._M_start;
  __position._M_current =
       (this->m_iterStack).
       super__Vector_base<xe::ConstTestNodeIterator::GroupState,_std::allocator<xe::ConstTestNodeIterator::GroupState>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  pCVar5 = this;
  if ((long)__position._M_current - (long)pGVar2 != 0x10) {
    pCVar5 = (ConstTestNodeIterator *)
             (((__position._M_current[-1].group)->m_children).
              super__Vector_base<xe::TestNode_*,_std::allocator<xe::TestNode_*>_>._M_impl.
              super__Vector_impl_data._M_start + __position._M_current[-1].childNdx);
  }
  local_18.group = (TestGroup *)pCVar5->m_root;
  if ((((local_18.group)->super_TestNode).m_nodeType < TESTNODETYPE_TEST_CASE) &&
     (0 < (int)((ulong)((long)((local_18.group)->m_children).
                              super__Vector_base<xe::TestNode_*,_std::allocator<xe::TestNode_*>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)((local_18.group)->m_children).
                             super__Vector_base<xe::TestNode_*,_std::allocator<xe::TestNode_*>_>.
                             _M_impl.super__Vector_impl_data._M_start) >> 3))) {
    local_18.childNdx = 0;
    if (__position._M_current ==
        (this->m_iterStack).
        super__Vector_base<xe::ConstTestNodeIterator::GroupState,_std::allocator<xe::ConstTestNodeIterator::GroupState>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<xe::ConstTestNodeIterator::GroupState,_std::allocator<xe::ConstTestNodeIterator::GroupState>_>
      ::_M_realloc_insert<xe::ConstTestNodeIterator::GroupState>
                (&this->m_iterStack,__position,&local_18);
    }
    else {
      (__position._M_current)->group = local_18.group;
      *(ulong *)&(__position._M_current)->childNdx = (ulong)(uint)local_18._12_4_ << 0x20;
      ppGVar1 = &(this->m_iterStack).
                 super__Vector_base<xe::ConstTestNodeIterator::GroupState,_std::allocator<xe::ConstTestNodeIterator::GroupState>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppGVar1 = *ppGVar1 + 1;
    }
  }
  else {
    do {
      pGVar7 = __position._M_current + -1;
      pTVar3 = pGVar7->group;
      if (pTVar3 == (TestGroup *)0x0) {
        iVar4 = 1;
      }
      else {
        iVar4 = (int)((ulong)((long)(pTVar3->m_children).
                                    super__Vector_base<xe::TestNode_*,_std::allocator<xe::TestNode_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(pTVar3->m_children).
                                   super__Vector_base<xe::TestNode_*,_std::allocator<xe::TestNode_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 3);
      }
      iVar6 = __position._M_current[-1].childNdx + 1;
      __position._M_current[-1].childNdx = iVar6;
    } while ((iVar6 == iVar4) &&
            ((this->m_iterStack).
             super__Vector_base<xe::ConstTestNodeIterator::GroupState,_std::allocator<xe::ConstTestNodeIterator::GroupState>_>
             ._M_impl.super__Vector_impl_data._M_finish = pGVar7, __position._M_current = pGVar7,
            pGVar7 != pGVar2));
  }
  return this;
}

Assistant:

ConstTestNodeIterator& ConstTestNodeIterator::operator++ (void)
{
	DE_ASSERT(!m_iterStack.empty());

	const TestNode*	curNode			= **this;
	TestNodeType	curNodeType		= curNode->getNodeType();

	if ((curNodeType == TESTNODETYPE_GROUP || curNodeType == TESTNODETYPE_ROOT) &&
		static_cast<const TestGroup*>(curNode)->getNumChildren() > 0)
	{
		m_iterStack.push_back(GroupState(static_cast<const TestGroup*>(curNode)));
	}
	else
	{
		for (;;)
		{
			const TestGroup*	group		= m_iterStack.back().group;
			int&				childNdx	= m_iterStack.back().childNdx;
			int					numChildren	= group ? group->getNumChildren() : 1;

			childNdx += 1;
			if (childNdx == numChildren)
			{
				m_iterStack.pop_back();
				if (m_iterStack.empty())
					break;
			}
			else
				break;
		}
	}

	return *this;
}